

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O1

void __thiscall
arangodb::velocypack::HexDump::HexDump
          (HexDump *this,uint8_t *data,ValueLength length,int valuesPerLine,string *separator,
          string *header)

{
  pointer pcVar1;
  
  this->data = data;
  this->length = length;
  this->valuesPerLine = valuesPerLine;
  (this->separator)._M_dataplus._M_p = (pointer)&(this->separator).field_2;
  pcVar1 = (separator->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->separator,pcVar1,pcVar1 + separator->_M_string_length);
  (this->header)._M_dataplus._M_p = (pointer)&(this->header).field_2;
  pcVar1 = (header->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->header,pcVar1,pcVar1 + header->_M_string_length);
  return;
}

Assistant:

HexDump(uint8_t const* data, ValueLength length, int valuesPerLine = 16,
          std::string const& separator = " ", std::string const& header = "0x")
      : data(data),
        length(length),
        valuesPerLine(valuesPerLine),
        separator(separator),
        header(header) {}